

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::AddAgents::operator()
          (AddAgents *this,iterator_t *first,iterator_t *last)

{
  bool bVar1;
  reference pbVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  string *in_stack_00000048;
  iterator l;
  iterator it;
  DecPOMDPDiscrete *in_stack_ffffffffffffff88;
  ParserDPOMDPFormat_Spirit *in_stack_ffffffffffffff90;
  undefined1 local_48 [40];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20 [4];
  
  GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)in_RDI->_M_current);
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,(size_t)first);
  local_20[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff88);
  local_48._32_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff88 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)in_RDI->_M_current)
    ;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_20);
    in_stack_ffffffffffffff90 = (ParserDPOMDPFormat_Spirit *)local_48;
    std::__cxx11::string::string((string *)in_stack_ffffffffffffff90,(string *)pbVar2);
    MultiAgentDecisionProcess::AddAgent((MultiAgentDecisionProcess *)l._M_current,in_stack_00000048)
    ;
    std::__cxx11::string::~string((string *)local_48);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    in_RDI->_M_current[2]._M_string_length = in_RDI->_M_current[2]._M_string_length + 1;
  }
  ClearCurIdentList(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void operator()(iterator_t first, iterator_t last) const
            {   
                _m_po->GetDecPOMDPDiscrete()->SetNrAgents(0);
                std::vector<std::string>::iterator it = _m_po->_m_curIdentList.begin();
                std::vector<std::string>::iterator l = _m_po->_m_curIdentList.end();
                while(it != l)
                {
                    _m_po->GetDecPOMDPDiscrete()->AddAgent(*it);
                    it++;
                    _m_po->_m_nrA++;
                }
                _m_po->ClearCurIdentList();
            }